

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importFilesWithSameName_Test::TestBody(Importer_importFilesWithSameName_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  element_type *peVar5;
  element_type *peVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  AssertHelper local_398 [8];
  Message local_390 [8];
  shared_ptr<libcellml::Model> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_3;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  iterator local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modelNames;
  AssertHelper local_268 [8];
  Message local_260 [15];
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_;
  Message local_238 [8];
  unsigned_long local_230 [2];
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208 [8];
  unsigned_long local_200 [2];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_1;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  shared_ptr<libcellml::Units> local_148;
  allocator<char> local_131;
  string local_130 [32];
  shared_ptr<libcellml::Component> local_110;
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  ModelPtr anotherModel;
  ImporterPtr importer;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Importer_importFilesWithSameName_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"importer/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x29a,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  libcellml::Importer::create((bool)((char)&anotherModel + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"anotherModelWithKey_model.cellml",&local_f9);
  libcellml::Model::create((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"b",&local_131);
  libcellml::Component::create((string *)&local_110);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar5);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"a",&local_169);
  libcellml::Units::create((string *)&local_148);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  peVar6 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&anotherModel.
                          super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"model.cellml",&local_191);
  libcellml::Importer::addModel((shared_ptr *)peVar6,(string *)local_d8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  peVar6 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&anotherModel.
                          super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"importer/",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  resourcePath(local_1b8);
  libcellml::Importer::resolveImports((shared_ptr *)peVar6,(string *)local_30);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_200[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &anotherModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_200[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1f0,"size_t(0)","importer->issueCount()",local_200 + 1,
             local_200);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2a5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_230[1] = 4;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &anotherModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_230[0] = libcellml::Importer::libraryCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_220,"size_t(4)","importer->libraryCount()",local_230 + 1,
             local_230);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(local_238);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2a8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  bVar3 = libcellml::Model::hasUnresolvedImports();
  local_251 = (bool)(~bVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar2) {
    testing::Message::Message(local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &modelNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_250,
               "model->hasUnresolvedImports()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2aa,pcVar4);
    testing::internal::AssertHelper::operator=(local_268,local_260);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    std::__cxx11::string::~string
              ((string *)
               &modelNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  i._3_1_ = 1;
  local_338 = &local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"layer3_model",(allocator<char> *)((long)&i + 7));
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_310,"layer2_model",(allocator<char> *)((long)&i + 6));
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f0,"layer1_model",(allocator<char> *)((long)&i + 5));
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"anotherModelWithKey_model.cellml",(allocator<char> *)((long)&i + 4));
  i._3_1_ = 0;
  local_2b0 = &local_330;
  local_2a8 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&i + 2));
  __l._M_len = local_2a8;
  __l._M_array = local_2b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2a0,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&i + 2));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&i + 2));
  local_4b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0;
  do {
    local_4b8 = local_4b8 + -1;
    std::__cxx11::string::~string((string *)local_4b8);
  } while (local_4b8 != &local_330);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  gtest_ar_3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    sVar1.ptr_ = gtest_ar_3.message_.ptr_;
    std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&anotherModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             libcellml::Importer::libraryCount();
    if (pbVar7 <= sVar1.ptr_) break;
    lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2a0,(size_type)gtest_ar_3.message_.ptr_);
    std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&anotherModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    libcellml::Importer::library((ulong *)&local_388);
    std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_388);
    libcellml::NamedEntity::name_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_358,"modelNames[i]","importer->library(i)->name()",lhs,
               &local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::shared_ptr<libcellml::Model>::~shared_ptr(&local_388);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
    if (!bVar2) {
      testing::Message::Message(local_390);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
      testing::internal::AssertHelper::AssertHelper
                (local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
                 ,0x2af,pcVar4);
      testing::internal::AssertHelper::operator=(local_398,local_390);
      testing::internal::AssertHelper::~AssertHelper(local_398);
      testing::Message::~Message(local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
    gtest_ar_3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_3.message_.ptr_)->field_0x1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_d8);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &anotherModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Importer, importFilesWithSameName)
{
    // This test is to see whether the importer correctly resolves imported sources, where
    // the imported files all have the same file name.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/model.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();

    // Manually add a model to the library with the "model.cellml" key.
    auto anotherModel = libcellml::Model::create("anotherModelWithKey_model.cellml");
    anotherModel->addComponent(libcellml::Component::create("b"));
    anotherModel->addUnits(libcellml::Units::create("a"));
    importer->addModel(anotherModel, "model.cellml");

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    // 4 items in the library.
    EXPECT_EQ(size_t(4), importer->libraryCount());

    EXPECT_FALSE(model->hasUnresolvedImports());

    // Compare the library items against their model name to be sure they're different.
    std::vector<std::string> modelNames = {"layer3_model", "layer2_model", "layer1_model", "anotherModelWithKey_model.cellml"};
    for (size_t i = 0; i < importer->libraryCount(); ++i) {
        EXPECT_EQ(modelNames[i], importer->library(i)->name());
    }
}